

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memfile.c
# Opt level: O0

void mdiffwrite(memfile *mf,void *buf,uint bytes)

{
  bool bVar1;
  char *pcVar2;
  boolean do_realloc;
  uint bytes_local;
  void *buf_local;
  memfile *mf_local;
  
  bVar1 = false;
  while ((uint)mf->difflen < mf->diffpos + bytes) {
    mf->difflen = mf->difflen + 0x1000;
    bVar1 = true;
  }
  if (bVar1) {
    pcVar2 = (char *)realloc(mf->diffbuf,(long)mf->difflen);
    mf->diffbuf = pcVar2;
  }
  memcpy(mf->diffbuf + mf->diffpos,buf,(ulong)bytes);
  mf->diffpos = bytes + mf->diffpos;
  return;
}

Assistant:

static void mdiffwrite(struct memfile *mf, const void *buf, unsigned int bytes)
{
	boolean do_realloc = FALSE;
	while (mf->difflen < mf->diffpos + bytes) {
	    mf->difflen += 4096;
	    do_realloc = TRUE;
	}

	if (do_realloc)
	    mf->diffbuf = realloc(mf->diffbuf, mf->difflen);
	memcpy(&mf->diffbuf[mf->diffpos], buf, bytes);
	mf->diffpos += bytes;
}